

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

void __thiscall
miniros::TransportTCP::setKeepAlive
          (TransportTCP *this,bool use,uint32_t idle,uint32_t interval,uint32_t count)

{
  Level LVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  byte in_SIL;
  long in_RDI;
  undefined4 in_R8D;
  bool enabled_4;
  int val_1;
  bool enabled_3;
  bool enabled_2;
  bool enabled_1;
  bool enabled;
  int val;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  LogLocation *in_stack_fffffffffffffe60;
  void *pvVar4;
  Level in_stack_fffffffffffffe74;
  string *in_stack_fffffffffffffe78;
  string *name;
  LogLocation *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Level LVar5;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe94;
  undefined1 local_f1 [33];
  undefined4 local_d0;
  undefined1 local_ca;
  allocator<char> local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator<char> local_41;
  string local_40 [36];
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  byte local_9;
  
  LVar5 = (Level)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    local_d0 = 0;
    iVar2 = setsockopt(*(int *)(in_RDI + 0x98),1,9,&local_d0,4);
    if (iVar2 != 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ ^ 0xffU) & 1
          ) != 0) {
        name = (string *)local_f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (allocator<char> *)in_stack_fffffffffffffe80);
        console::initializeLogLocation(in_stack_fffffffffffffe80,name,in_stack_fffffffffffffe74);
        std::__cxx11::string::~string((string *)(local_f1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_f1);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   LVar5);
        console::checkLogLocationEnabled(in_stack_fffffffffffffe60);
      }
      LVar5 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_;
      if ((setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ & 1U) != 0
         ) {
        uVar6 = *(undefined4 *)(in_RDI + 0x98);
        pvVar4 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_;
        uVar3 = std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar4,(Level)(ulong)LVar5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xe2,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]",uVar6,uVar3);
      }
    }
  }
  else {
    local_1c = 1;
    local_18 = in_R8D;
    local_14 = in_ECX;
    local_10 = in_EDX;
    iVar2 = setsockopt(*(int *)(in_RDI + 0x98),1,9,&local_1c,4);
    if (iVar2 != 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setKeepAlive::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (allocator<char> *)in_stack_fffffffffffffe80);
        console::initializeLogLocation
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        std::__cxx11::string::~string(local_40);
        std::allocator<char>::~allocator(&local_41);
      }
      if (setKeepAlive::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   LVar5);
        console::checkLogLocationEnabled(in_stack_fffffffffffffe60);
      }
      pvVar4 = setKeepAlive::loc.logger_;
      LVar1 = setKeepAlive::loc.level_;
      local_55 = (setKeepAlive::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_55) {
        in_stack_fffffffffffffe50 = *(undefined4 *)(in_RDI + 0x98);
        uVar3 = std::__cxx11::string::c_str();
        LVar5 = Debug;
        console::print((FilterBase *)0x0,pvVar4,(Level)(ulong)LVar1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xbb,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]",
                       in_stack_fffffffffffffe50,uVar3);
      }
    }
    local_1c = local_10;
    iVar2 = setsockopt(*(int *)(in_RDI + 0x98),6,4,&local_1c,4);
    if (iVar2 != 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ ^ 0xffU) & 1
          ) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (allocator<char> *)in_stack_fffffffffffffe80);
        console::initializeLogLocation
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator(&local_79);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   LVar5);
        console::checkLogLocationEnabled(in_stack_fffffffffffffe60);
      }
      pvVar4 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_;
      LVar1 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_;
      local_7a = (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ &
                 1U) != 0;
      if ((bool)local_7a) {
        in_stack_fffffffffffffe50 = *(undefined4 *)(in_RDI + 0x98);
        uVar3 = std::__cxx11::string::c_str();
        LVar5 = Debug;
        console::print((FilterBase *)0x0,pvVar4,(Level)(ulong)LVar1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xc3,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set TCP_KEEPIDLE on socket [%d] [%s]",
                       in_stack_fffffffffffffe50,uVar3);
      }
    }
    local_1c = local_14;
    iVar2 = setsockopt(*(int *)(in_RDI + 0x98),6,5,&local_1c,4);
    if (iVar2 != 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ ^ 0xffU) & 1
          ) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (allocator<char> *)in_stack_fffffffffffffe80);
        console::initializeLogLocation
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   LVar5);
        console::checkLogLocationEnabled(in_stack_fffffffffffffe60);
      }
      pvVar4 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_;
      LVar1 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_;
      local_a2 = (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ &
                 1U) != 0;
      if ((bool)local_a2) {
        in_stack_fffffffffffffe50 = *(undefined4 *)(in_RDI + 0x98);
        uVar3 = std::__cxx11::string::c_str();
        LVar5 = Debug;
        console::print((FilterBase *)0x0,pvVar4,(Level)(ulong)LVar1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xcd,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set TCP_KEEPINTVL on socket [%d] [%s]",
                       in_stack_fffffffffffffe50,uVar3);
      }
    }
    local_1c = local_18;
    iVar2 = setsockopt(*(int *)(in_RDI + 0x98),6,6,&local_1c,4);
    if (iVar2 != 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ ^ 0xffU) & 1
          ) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (allocator<char> *)in_stack_fffffffffffffe80);
        console::initializeLogLocation
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   LVar5);
        console::checkLogLocationEnabled(in_stack_fffffffffffffe60);
      }
      local_ca = (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ &
                 1U) != 0;
      if ((bool)local_ca) {
        uVar6 = *(undefined4 *)(in_RDI + 0x98);
        pvVar4 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_;
        LVar5 = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_;
        uVar3 = std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar4,(Level)(ulong)LVar5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xd7,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set TCP_KEEPCNT on socket [%d] [%s]",uVar6,uVar3);
      }
    }
  }
  return;
}

Assistant:

void TransportTCP::setKeepAlive(bool use, uint32_t idle, uint32_t interval, uint32_t count)
{
  if (use)
  {
    int val = 1;
    if (setsockopt(sock_, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<const char*>(&val), sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }

/* cygwin SOL_TCP does not seem to support TCP_KEEPIDLE, TCP_KEEPINTVL, TCP_KEEPCNT */
#if defined(SOL_TCP) && defined(TCP_KEEPIDLE)
    val = idle;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPIDLE, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPIDLE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)idle;
#endif

#if defined(SOL_TCP) && defined(TCP_KEEPINTVL)
    val = interval;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPINTVL, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPINTVL on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)interval;
#endif

#if defined(SOL_TCP) && defined(TCP_KEEPCNT)
    val = count;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPCNT, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPCNT on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)count;
#endif
  }
  else
  {
    int val = 0;
    if (setsockopt(sock_, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<const char*>(&val), sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
  }
}